

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O3

void __thiscall
Js::StepController::HandleResumeAction
          (StepController *this,InterpreterHaltState *haltState,BREAKRESUMEACTION resumeAction)

{
  ReturnedValueList *pRVar1;
  long lVar2;
  uint uVar3;
  
  this->returnedValueRecordingDepth = 0;
  pRVar1 = this->returnedValueList;
  if ((pRVar1 != (ReturnedValueList *)0x0) &&
     (lVar2 = (long)(pRVar1->
                    super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
                    count, lVar2 != 0)) {
    memset((pRVar1->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
           buffer.ptr,0,lVar2 << 3);
    (pRVar1->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).count = 0;
  }
  uVar3 = resumeAction - BREAKRESUMEACTION_STEP_INTO;
  if ((uVar3 < 5) && ((0x17U >> (uVar3 & 0x1f) & 1) != 0)) {
    Activate(this,(StepType)(0x801040201 >> ((char)uVar3 * '\b' & 0x3fU)),haltState);
    return;
  }
  return;
}

Assistant:

void StepController::HandleResumeAction(Js::InterpreterHaltState* haltState, BREAKRESUMEACTION resumeAction)
    {
        ResetReturnedValueList();
        switch (resumeAction)
        {
        case BREAKRESUMEACTION_STEP_INTO:
            Activate(Js::STEP_IN, haltState);
            break;
        case BREAKRESUMEACTION_STEP_OVER:
            Activate(Js::STEP_OVER, haltState);
            break;
        case BREAKRESUMEACTION_STEP_OUT:
            Activate(Js::STEP_OUT, haltState);
            break;
        case BREAKRESUMEACTION_STEP_DOCUMENT:
            Activate(Js::STEP_DOCUMENT, haltState);
            break;
        }
    }